

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void * heap_alloc(heap_t *heap,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  heap_chunk_t *phVar3;
  void *data;
  heap_chunk_t *chunk;
  size_t size_local;
  heap_t *heap_local;
  
  uVar2 = size + 7 & 0xfffffffffffffff8;
  if ((heap->chunk == (heap_chunk_t *)0x0) || (0x1000 < heap->size + uVar2)) {
    phVar3 = (heap_chunk_t *)malloc(0x1008);
    phVar3->next = heap->chunk;
    heap->chunk = phVar3;
    heap->size = 0;
  }
  sVar1 = heap->size;
  heap->size = uVar2 + heap->size;
  return (void *)((long)&heap->chunk[1].next + sVar1);
}

Assistant:

static void* heap_alloc(heap_t* heap, size_t size)
{
    size = ALIGN_SIZE(size);
    if(heap->chunk == NULL || heap->size + size > CHUNK_SIZE) {
        heap_chunk_t* chunk = malloc(CHUNK_SIZE + sizeof(heap_chunk_t));
        chunk->next = heap->chunk;
        heap->chunk = chunk;
        heap->size = 0;
    }

    void* data = (char*)(heap->chunk) + sizeof(heap_chunk_t) + heap->size;
    heap->size += size;
    return data;
}